

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O3

void __thiscall
wasm::EquivalentClass::deriveParams(wasm::Module*,std::vector<wasm::ParamInfo,std::allocator<wasm::
ParamInfo>>&,bool)::DeepValueIterator::DeepValueIterator(wasm::Expression___
          (void *this,Expression **root)

{
  Expression **local_28;
  Expression **root_local;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)((long)this + 0x58) = 0;
  *(undefined8 *)((long)this + 0x60) = 0;
  *(undefined8 *)((long)this + 0x68) = 0;
  local_28 = root;
  SmallVector<wasm::Expression_**,_10UL>::push_back
            ((SmallVector<wasm::Expression_**,_10UL> *)this,&local_28);
  return;
}

Assistant:

DeepValueIterator(Expression** root) { tasks.push_back(root); }